

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ResetOneSchema(sqlite3 *db,int iDb)

{
  long lVar1;
  int in_ESI;
  void *in_RDI;
  int i;
  undefined4 local_10;
  
  if (-1 < in_ESI) {
    lVar1 = *(long *)(*(long *)((long)in_RDI + 0x20) + (long)in_ESI * 0x20 + 0x18);
    *(ushort *)(lVar1 + 0x72) = *(ushort *)(lVar1 + 0x72) | 8;
    lVar1 = *(long *)(*(long *)((long)in_RDI + 0x20) + 0x38);
    *(ushort *)(lVar1 + 0x72) = *(ushort *)(lVar1 + 0x72) | 8;
    *(uint *)((long)in_RDI + 0x2c) = *(uint *)((long)in_RDI + 0x2c) & 0xffffffef;
  }
  if (*(int *)((long)in_RDI + 0x48) == 0) {
    for (local_10 = 0; local_10 < *(int *)((long)in_RDI + 0x28); local_10 = local_10 + 1) {
      if ((*(ushort *)
            (*(long *)(*(long *)((long)in_RDI + 0x20) + (long)local_10 * 0x20 + 0x18) + 0x72) & 8)
          == 8) {
        sqlite3SchemaClear(in_RDI);
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ResetOneSchema(sqlite3 *db, int iDb){
  int i;
  assert( iDb<db->nDb );

  if( iDb>=0 ){
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    DbSetProperty(db, iDb, DB_ResetWanted);
    DbSetProperty(db, 1, DB_ResetWanted);
    db->mDbFlags &= ~DBFLAG_SchemaKnownOk;
  }

  if( db->nSchemaLock==0 ){
    for(i=0; i<db->nDb; i++){
      if( DbHasProperty(db, i, DB_ResetWanted) ){
        sqlite3SchemaClear(db->aDb[i].pSchema);
      }
    }
  }
}